

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.cpp
# Opt level: O3

ssize_t __thiscall zmq::pipe_t::write(pipe_t *this,int __fd,void *__buf,size_t __n)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ssize_t sVar4;
  undefined4 in_register_00000034;
  msg_t *this_00;
  
  this_00 = (msg_t *)CONCAT44(in_register_00000034,__fd);
  sVar4 = 0;
  if ((this->_out_active == true) && (this->_state == active)) {
    if (((long)this->_hwm < 1) ||
       (this->_msgs_written - this->_peers_msgs_read < (ulong)(long)this->_hwm)) {
      bVar1 = msg_t::flags(this_00);
      bVar2 = msg_t::is_routing_id(this_00);
      iVar3 = (*this->_out_pipe->_vptr_ypipe_base_t[2])(this->_out_pipe,this_00,(ulong)(bVar1 & 1));
      sVar4 = CONCAT71((int7)(CONCAT44(extraout_var,iVar3) >> 8),1);
      if (!bVar2 && (bVar1 & 1) == 0) {
        this->_msgs_written = this->_msgs_written + 1;
      }
    }
    else {
      this->_out_active = false;
      sVar4 = 0;
    }
  }
  return sVar4;
}

Assistant:

bool zmq::pipe_t::write (const msg_t *msg_)
{
    if (unlikely (!check_write ()))
        return false;

    const bool more = (msg_->flags () & msg_t::more) != 0;
    const bool is_routing_id = msg_->is_routing_id ();
    _out_pipe->write (*msg_, more);
    if (!more && !is_routing_id)
        _msgs_written++;

    return true;
}